

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::calc_last_char(Fl_Text_Display *this)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)this->mNVisibleLines;
  do {
    if ((int)uVar4 < 1) {
      iVar3 = 0;
      goto LAB_001d1cf5;
    }
    uVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar1;
  } while (this->mLineStarts[lVar2] == -1);
  iVar3 = line_end(this,this->mLineStarts[uVar1 & 0xffffffff],true);
LAB_001d1cf5:
  this->mLastChar = iVar3;
  return;
}

Assistant:

void Fl_Text_Display::calc_last_char() {
  int i;
  for (i = mNVisibleLines - 1; i >= 0 && mLineStarts[i] == -1; i--) ;
  mLastChar = i < 0 ? 0 : line_end(mLineStarts[i], true);
}